

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_MuxRestructure(Gia_Man_t *pNew,Str_Ntk_t *pNtk,int iMux,int nMuxes,Vec_Int_t *vDelay,
                      int nLutSize,int fRecursive,int fOptArea,int fVerbose)

{
  int nLutSize_local;
  Vec_Int_t *vDelay_local;
  int nMuxes_local;
  int iMux_local;
  Str_Ntk_t *pNtk_local;
  Gia_Man_t *pNew_local;
  
  if (fOptArea == 0) {
    if (fRecursive == 0) {
      pNew_local._4_4_ = Str_MuxRestructure1(pNew,pNtk,iMux,nMuxes,vDelay,nLutSize,fVerbose);
    }
    else {
      pNew_local._4_4_ = Str_MuxRestructure2(pNew,pNtk,iMux,nMuxes,vDelay,nLutSize,fVerbose);
    }
  }
  else if (nMuxes < 2) {
    pNew_local._4_4_ = Str_MuxRestructure1(pNew,pNtk,iMux,nMuxes,vDelay,nLutSize,fVerbose);
  }
  else {
    pNew_local._4_4_ = Str_MuxRestructureArea(pNew,pNtk,iMux,nMuxes,vDelay,nLutSize,fVerbose);
  }
  return pNew_local._4_4_;
}

Assistant:

int Str_MuxRestructure( Gia_Man_t * pNew, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize, int fRecursive, int fOptArea, int fVerbose )
{
    extern int Str_MuxRestructureArea( Gia_Man_t * pNew, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize, int fVerbose );
    if ( fOptArea )
    {
        if ( nMuxes < 2 )
            return Str_MuxRestructure1( pNew, pNtk, iMux, nMuxes, vDelay, nLutSize, fVerbose );
        return Str_MuxRestructureArea( pNew, pNtk, iMux, nMuxes, vDelay, nLutSize, fVerbose );
    }
    if ( fRecursive )
        return Str_MuxRestructure2( pNew, pNtk, iMux, nMuxes, vDelay, nLutSize, fVerbose );
    return Str_MuxRestructure1( pNew, pNtk, iMux, nMuxes, vDelay, nLutSize, fVerbose );
}